

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createSpecConstantOp
          (Builder *this,Op opCode,Id typeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *operands,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *literals)

{
  const_iterator cVar1;
  bool bVar2;
  Id IVar3;
  Instruction *this_00;
  size_type sVar4;
  size_type sVar5;
  reference puVar6;
  value_type local_58;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_48;
  const_iterator it_1;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_38;
  const_iterator it;
  Instruction *op;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *literals_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *operands_local;
  Id typeId_local;
  Op opCode_local;
  Builder *this_local;
  
  this_00 = (Instruction *)::operator_new(0x60);
  IVar3 = getUniqueId(this);
  spv::Instruction::Instruction(this_00,IVar3,typeId,OpSpecConstantOp);
  it._M_current = (uint *)this_00;
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(operands);
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(literals);
  spv::Instruction::reserveOperands(this_00,sVar4 + sVar5 + 1);
  spv::Instruction::addImmediateOperand((Instruction *)it._M_current,opCode);
  local_38._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cbegin(operands);
  while( true ) {
    it_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cend(operands);
    bVar2 = __gnu_cxx::operator!=(&local_38,&it_1);
    cVar1 = it;
    if (!bVar2) break;
    puVar6 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_38);
    spv::Instruction::addIdOperand((Instruction *)cVar1._M_current,*puVar6);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_38);
  }
  local_48._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cbegin(literals);
  while( true ) {
    local_50._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cend(literals);
    bVar2 = __gnu_cxx::operator!=(&local_48,&local_50);
    cVar1 = it;
    if (!bVar2) break;
    puVar6 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_48);
    spv::Instruction::addImmediateOperand((Instruction *)cVar1._M_current,*puVar6);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_48);
  }
  Module::mapInstruction(&this->module,(Instruction *)it._M_current);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_58,
             (pointer)it._M_current);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->constantsTypesGlobals,&local_58);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_58);
  bVar2 = containsType(this,typeId,OpTypeInt,8);
  if (bVar2) {
    addCapability(this,CapabilityInt8);
  }
  bVar2 = containsType(this,typeId,OpTypeInt,0x10);
  if (bVar2) {
    addCapability(this,CapabilityInt16);
  }
  bVar2 = containsType(this,typeId,OpTypeFloat,0x10);
  if (bVar2) {
    addCapability(this,CapabilityFloat16);
  }
  IVar3 = spv::Instruction::getResultId((Instruction *)it._M_current);
  return IVar3;
}

Assistant:

Id Builder::createSpecConstantOp(Op opCode, Id typeId, const std::vector<Id>& operands,
    const std::vector<unsigned>& literals)
{
    Instruction* op = new Instruction(getUniqueId(), typeId, OpSpecConstantOp);
    op->reserveOperands(operands.size() + literals.size() + 1);
    op->addImmediateOperand((unsigned) opCode);
    for (auto it = operands.cbegin(); it != operands.cend(); ++it)
        op->addIdOperand(*it);
    for (auto it = literals.cbegin(); it != literals.cend(); ++it)
        op->addImmediateOperand(*it);
    module.mapInstruction(op);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(op));

    // OpSpecConstantOp's using 8 or 16 bit types require the associated capability
    if (containsType(typeId, OpTypeInt, 8))
        addCapability(CapabilityInt8);
    if (containsType(typeId, OpTypeInt, 16))
        addCapability(CapabilityInt16);
    if (containsType(typeId, OpTypeFloat, 16))
        addCapability(CapabilityFloat16);

    return op->getResultId();
}